

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LandPlatformAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::LandPlatformAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LandPlatformAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KINT32 Value_03;
  KINT32 Value_04;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  LandPlatformAppearance *local_18;
  LandPlatformAppearance *this_local;
  
  local_18 = this;
  this_local = (LandPlatformAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Land Platform Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme:           ");
  ENUMS::GetEnumAsStringPaintScheme_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tMobility Kill:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFire Power Kill:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tDamage:                 ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tSmoke:                  ");
  ENUMS::GetEnumAsStringEntitySmoke_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)((uint)*this >> 5 & 3),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tTrailing Effect:        ");
  ENUMS::GetEnumAsStringEntityTrailingEffect_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\n\tHatch State:            ");
  ENUMS::GetEnumAsStringEntityHatchState_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)((uint)*this >> 9 & 7),Value_03);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"\n\tHead Lights:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xc & 1);
  poVar1 = std::operator<<(poVar1,"\n\tTail Lights:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xd & 1);
  poVar1 = std::operator<<(poVar1,"\n\tBrake Lights:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xe & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFlaming Effect:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xf & 1);
  poVar1 = std::operator<<(poVar1,"\n\tLauncher:               ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x10 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tCamouflage:             ");
  ENUMS::GetEnumAsStringEntityCamouflage_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)((uint)*this >> 0x11 & 3),Value_04);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"\n\tConcealed:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x13 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tPower Plant:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x16 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tTent:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x18 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tRamp:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x19 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tBlackout Lights:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1a & 1);
  poVar1 = std::operator<<(poVar1,"\n\tBlackout Brake Lights:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1b & 1);
  poVar1 = std::operator<<(poVar1,"\n\tSpot Lights:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1c & 1);
  poVar1 = std::operator<<(poVar1,"\n\tInterior Lights:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1d & 1);
  poVar1 = std::operator<<(poVar1,"\n\tSurrender State:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1e & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMasked/Cloaked:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1f);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LandPlatformAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Land Platform Appearance:"
       << "\n\tPaint Scheme:           " << GetEnumAsStringPaintScheme( m_PaintScheme )
	   << "\n\tMobility Kill:          " << m_MobilityKill
       << "\n\tFire Power Kill:        " << m_FirePower
       << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tSmoke:                  " << GetEnumAsStringEntitySmoke( m_Smoke )
       << "\n\tTrailing Effect:        " << GetEnumAsStringEntityTrailingEffect( m_TrailingEffect )
       << "\n\tHatch State:            " << GetEnumAsStringEntityHatchState( m_HatchState )
	   << "\n\tHead Lights:            " << m_HeadLights
	   << "\n\tTail Lights:            " << m_TailLights 
	   << "\n\tBrake Lights:           " << m_BrakeLights	   
       << "\n\tFlaming Effect:         " << m_FlamingEffectField		
	   << "\n\tLauncher:               " << m_Launcher
       << "\n\tCamouflage:             " << GetEnumAsStringEntityCamouflage( m_Camouflage )
       << "\n\tConcealed:              " << m_Concealed
       << "\n\tFrozen Status:          " << m_FrozenStatus
       << "\n\tPower Plant:            " << m_PowerPlantStatus
       << "\n\tState:                  " << m_State
       << "\n\tTent:                   " << m_Tent
       << "\n\tRamp:                   " << m_Ramp
	   << "\n\tBlackout Lights:        " << m_BlackoutLights
	   << "\n\tBlackout Brake Lights:  " << m_BlackoutBrakeLights
	   << "\n\tSpot Lights:            " << m_SpotLights
	   << "\n\tInterior Lights:        " << m_InteriorLights
	   << "\n\tSurrender State:        " << m_SurrenderState 
	   << "\n\tMasked/Cloaked:         " << m_MaskedCloaked
       << "\n";

    return ss.str();
}